

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O2

void __thiscall arangodb::velocypack::Parser::scanDigits(Parser *this,ParsedNumber *value)

{
  int i;
  
  while( true ) {
    i = consume(this);
    if (i < 0) {
      return;
    }
    if (i - 0x3aU < 0xfffffff6) break;
    ParsedNumber::addDigit(value,i);
  }
  this->_pos = this->_pos - 1;
  return;
}

Assistant:

void scanDigits(ParsedNumber& value) {
    while (true) {
      int i = consume();
      if (i < 0) {
        return;
      }
      if (i < '0' || i > '9') {
        unconsume();
        return;
      }
      value.addDigit(i);
    }
  }